

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int runC(lua_State *L,lua_State *L1,char *pc)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *r;
  size_t sVar8;
  ulong uVar9;
  lua_CFunction p_Var10;
  lua_Integer n;
  void *pvVar11;
  char *pcVar12;
  char *pcVar13;
  lua_State *plVar14;
  lua_State *to;
  code *pcVar15;
  lua_KContext lVar16;
  bool bVar17;
  undefined8 uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  char buff [300];
  int local_180;
  int local_17c;
  char local_178;
  char cStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  char cStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  char local_170;
  undefined1 uStack_16f;
  undefined1 uStack_16e;
  undefined1 uStack_16d;
  undefined4 uStack_16c;
  char local_168;
  char *local_40;
  int local_34;
  
  local_40 = pc;
  if (pc == (char *)0x0) {
    iVar6 = luaL_error(L,"attempt to runC null script");
    return iVar6;
  }
  local_17c = 0;
  do {
    getstring_aux(L,&local_178,&local_40);
    auVar18 = in_ZMM0._0_16_;
    uVar20 = in_ZMM0._8_8_;
    if (local_178 == '\0') {
      iVar6 = 1;
      local_180 = 0;
      goto LAB_00134ac2;
    }
    if (local_170 == '\0' &&
        CONCAT17(uStack_171,
                 CONCAT16(uStack_172,
                          CONCAT15(uStack_173,
                                   CONCAT14(cStack_174,
                                            CONCAT13(uStack_175,
                                                     CONCAT12(uStack_176,
                                                              CONCAT11(cStack_177,local_178)))))))
        == 0x7865646e69736261) {
      iVar6 = getindex_aux(L,L1,&local_40);
      iVar6 = lua_absindex(L1,iVar6);
      auVar18._0_8_ = (double)iVar6;
      auVar18._8_8_ = in_XMM1_Qb;
LAB_00134a3e:
      in_ZMM0 = ZEXT1664(auVar18);
      lua_pushnumber(L1,auVar18._0_8_);
LAB_00134abf:
      iVar6 = 0;
    }
    else {
      if (CONCAT13(uStack_172,CONCAT12(uStack_173,CONCAT11(cStack_174,uStack_175))) == 0x646e65 &&
          CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) == 0x65707061) {
        iVar6 = getindex_aux(L,L1,&local_40);
        sVar8 = lua_rawlen(L1,iVar6);
        lua_rawseti(L1,iVar6,(long)((int)sVar8 + 1));
        goto LAB_00134abf;
      }
      if (CONCAT11(uStack_173,cStack_174) == 0x68 &&
          CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) == 0x74697261) {
        skip(&local_40);
        cVar1 = *local_40;
        local_40 = local_40 + 1;
        pvVar11 = memchr("+-*%^/\\&|~<>_!",(int)cVar1,0xf);
        lua_arith(L1,(int)pvVar11 + -0x158168);
        goto LAB_00134abf;
      }
      if (cStack_174 == '\0' &&
          CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) == 0x6c6c6163) {
        iVar5 = getnum_aux(L,L1,&local_40);
        iVar3 = getnum_aux(L,L1,&local_40);
        iVar6 = 0;
        lua_callk(L1,iVar5,iVar3,0,(lua_KFunction)0x0);
      }
      else if (CONCAT11(uStack_173,cStack_174) == 0x6b &&
               CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
               0x6c6c6163) {
        iVar6 = getnum_aux(L,L1,&local_40);
        iVar5 = getnum_aux(L,L1,&local_40);
        iVar3 = getindex_aux(L,L1,&local_40);
        lua_callk(L1,iVar6,iVar5,(long)iVar3,Cfunck);
LAB_00134b5b:
        iVar6 = 0;
      }
      else if (CONCAT17(uStack_16e,
                        CONCAT16(uStack_16f,
                                 CONCAT15(local_170,
                                          CONCAT14(uStack_171,
                                                   CONCAT13(uStack_172,
                                                            CONCAT12(uStack_173,
                                                                     CONCAT11(cStack_174,uStack_175)
                                                                    )))))) == 0x6b636174736b63 &&
               CONCAT17(uStack_171,
                        CONCAT16(uStack_172,
                                 CONCAT15(uStack_173,
                                          CONCAT14(cStack_174,
                                                   CONCAT13(uStack_175,
                                                            CONCAT12(uStack_176,
                                                                     CONCAT11(cStack_177,local_178))
                                                           ))))) == 0x6174736b63656863) {
        iVar5 = getnum_aux(L,L1,&local_40);
        getstring_aux(L,&local_178,&local_40);
        iVar6 = 0;
        pcVar13 = (char *)0x0;
        if (local_178 != '\0') {
          pcVar13 = &local_178;
        }
        luaL_checkstack(L1,iVar5,pcVar13);
      }
      else {
        if (CONCAT17(uStack_171,
                     CONCAT16(uStack_172,
                              CONCAT15(uStack_173,
                                       CONCAT14(cStack_174,
                                                CONCAT13(uStack_175,
                                                         CONCAT12(uStack_176,
                                                                  CONCAT11(cStack_177,local_178)))))
                             )) != 0x657261706d6f63) {
          if (CONCAT13(uStack_172,CONCAT12(uStack_173,CONCAT11(cStack_174,uStack_175))) == 0x746163
              && CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                 0x636e6f63) {
            iVar6 = getnum_aux(L,L1,&local_40);
            lua_concat(L1,iVar6);
            goto LAB_00134b5b;
          }
          if (cStack_174 == '\0' &&
              CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) == 0x79706f63
             ) {
            iVar6 = getindex_aux(L,L1,&local_40);
            iVar5 = getindex_aux(L,L1,&local_40);
            lua_copy(L1,iVar6,iVar5);
            goto LAB_00134abf;
          }
          if (local_170 == '\0' &&
              CONCAT17(uStack_171,
                       CONCAT16(uStack_172,
                                CONCAT15(uStack_173,
                                         CONCAT14(cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                 )))) == 0x6d756e32636e7566) {
            iVar6 = getindex_aux(L,L1,&local_40);
            p_Var10 = lua_tocfunction(L1,iVar6);
            auVar2._8_8_ = in_XMM1_Qb;
            auVar2._0_8_ = in_XMM1_Qa;
            auVar18 = vcvtusi2sd_avx512f(auVar2,p_Var10);
            goto LAB_00134a3e;
          }
          if (local_170 == '\0' &&
              CONCAT17(uStack_171,
                       CONCAT16(uStack_172,
                                CONCAT15(uStack_173,
                                         CONCAT14(cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                 )))) == 0x646c656966746567) {
            iVar6 = getindex_aux(L,L1,&local_40);
            getstring_aux(L,&local_178,&local_40);
            lua_getfield(L1,iVar6,&local_178);
          }
          else if (CONCAT11(uStack_16f,local_170) == 0x6c &&
                   CONCAT17(uStack_171,
                            CONCAT16(uStack_172,
                                     CONCAT15(uStack_173,
                                              CONCAT14(cStack_174,
                                                       CONCAT13(uStack_175,
                                                                CONCAT12(uStack_176,
                                                                         CONCAT11(cStack_177,
                                                                                  local_178)))))))
                   == 0x61626f6c67746567) {
            getstring_aux(L,&local_178,&local_40);
            lua_getglobal(L1,&local_178);
          }
          else {
            if (CONCAT17((undefined1)uStack_16c,
                         CONCAT16(uStack_16d,
                                  CONCAT15(uStack_16e,
                                           CONCAT14(uStack_16f,
                                                    CONCAT13(local_170,
                                                             CONCAT12(uStack_171,
                                                                      CONCAT11(uStack_172,uStack_173
                                                                              ))))))) ==
                0x656c6261746174 &&
                CONCAT17(uStack_171,
                         CONCAT16(uStack_172,
                                  CONCAT15(uStack_173,
                                           CONCAT14(cStack_174,
                                                    CONCAT13(uStack_175,
                                                             CONCAT12(uStack_176,
                                                                      CONCAT11(cStack_177,local_178)
                                                                     )))))) == 0x746174656d746567) {
              iVar6 = getindex_aux(L,L1,&local_40);
              iVar5 = lua_getmetatable(L1,iVar6);
              iVar6 = 0;
              if (iVar5 == 0) {
                lua_pushnil(L1);
              }
              goto LAB_00134ac2;
            }
            if (local_170 == '\0' &&
                CONCAT17(uStack_171,
                         CONCAT16(uStack_172,
                                  CONCAT15(uStack_173,
                                           CONCAT14(cStack_174,
                                                    CONCAT13(uStack_175,
                                                             CONCAT12(uStack_176,
                                                                      CONCAT11(cStack_177,local_178)
                                                                     )))))) == 0x656c626174746567) {
              iVar6 = getindex_aux(L,L1,&local_40);
              lua_gettable(L1,iVar6);
            }
            else if (CONCAT13(uStack_172,CONCAT12(uStack_173,CONCAT11(cStack_174,uStack_175))) ==
                     0x706f74 &&
                     CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                     0x74746567) {
              iVar6 = lua_gettop(L1);
              lua_pushinteger(L1,(long)iVar6);
            }
            else {
              if (cStack_174 == '\0' &&
                  CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                  0x62757367) {
                iVar5 = getnum_aux(L,L1,&local_40);
                iVar3 = getnum_aux(L,L1,&local_40);
                local_34 = getnum_aux(L,L1,&local_40);
                iVar6 = 0;
                pcVar13 = lua_tolstring(L1,iVar5,(size_t *)0x0);
                pcVar12 = lua_tolstring(L1,iVar3,(size_t *)0x0);
                r = lua_tolstring(L1,local_34,(size_t *)0x0);
                luaL_gsub(L1,pcVar13,pcVar12,r);
                goto LAB_00134ac2;
              }
              if (CONCAT13(uStack_172,CONCAT12(uStack_173,CONCAT11(cStack_174,uStack_175))) ==
                  0x747265 &&
                  CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                  0x65736e69) {
                iVar6 = getnum_aux(L,L1,&local_40);
                lua_rotate(L1,iVar6,1);
                goto LAB_00134abf;
              }
              if (CONCAT13(uStack_16d,CONCAT12(uStack_16e,CONCAT11(uStack_16f,local_170))) ==
                  0x6e6f69 &&
                  CONCAT17(uStack_171,
                           CONCAT16(uStack_172,
                                    CONCAT15(uStack_173,
                                             CONCAT14(cStack_174,
                                                      CONCAT13(uStack_175,
                                                               CONCAT12(uStack_176,
                                                                        CONCAT11(cStack_177,
                                                                                 local_178))))))) ==
                  0x74636e7566637369) {
                iVar6 = getindex_aux(L,L1,&local_40);
                uVar7 = lua_iscfunction(L1,iVar6);
                goto LAB_00135069;
              }
              if (CONCAT17(uStack_16e,
                           CONCAT16(uStack_16f,
                                    CONCAT15(local_170,
                                             CONCAT14(uStack_171,
                                                      CONCAT13(uStack_172,
                                                               CONCAT12(uStack_173,
                                                                        CONCAT11(cStack_174,
                                                                                 uStack_175)))))))
                  == 0x6e6f6974636e75 &&
                  CONCAT17(uStack_171,
                           CONCAT16(uStack_172,
                                    CONCAT15(uStack_173,
                                             CONCAT14(cStack_174,
                                                      CONCAT13(uStack_175,
                                                               CONCAT12(uStack_176,
                                                                        CONCAT11(cStack_177,
                                                                                 local_178))))))) ==
                  0x6974636e75667369) {
                iVar6 = getindex_aux(L,L1,&local_40);
                iVar6 = lua_type(L1,iVar6);
                bVar17 = iVar6 == 6;
LAB_00135062:
                uVar7 = (uint)bVar17;
              }
              else {
                if (CONCAT11(uStack_173,cStack_174) == 0x6c &&
                    CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                    0x696e7369) {
                  iVar6 = getindex_aux(L,L1,&local_40);
                  iVar6 = lua_type(L1,iVar6);
                  bVar17 = iVar6 == 0;
                  goto LAB_00135062;
                }
                if (CONCAT13(uStack_172,CONCAT12(uStack_173,CONCAT11(cStack_174,uStack_175))) ==
                    0x6c6c75 &&
                    CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                    0x756e7369) {
                  iVar6 = getindex_aux(L,L1,&local_40);
                  iVar6 = lua_type(L1,iVar6);
                  bVar17 = iVar6 == -1;
                  goto LAB_00135062;
                }
                if (local_170 == '\0' &&
                    CONCAT17(uStack_171,
                             CONCAT16(uStack_172,
                                      CONCAT15(uStack_173,
                                               CONCAT14(cStack_174,
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178)))))))
                    == 0x7265626d756e7369) {
                  iVar6 = getindex_aux(L,L1,&local_40);
                  uVar7 = lua_isnumber(L1,iVar6);
                }
                else {
                  if (local_170 != '\0' ||
                      CONCAT17(uStack_171,
                               CONCAT16(uStack_172,
                                        CONCAT15(uStack_173,
                                                 CONCAT14(cStack_174,
                                                          CONCAT13(uStack_175,
                                                                   CONCAT12(uStack_176,
                                                                            CONCAT11(cStack_177,
                                                                                     local_178))))))
                              ) != 0x676e697274737369) {
                    if (CONCAT17(uStack_171,
                                 CONCAT16(uStack_172,
                                          CONCAT15(uStack_173,
                                                   CONCAT14(cStack_174,
                                                            CONCAT13(uStack_175,
                                                                     CONCAT12(uStack_176,
                                                                              CONCAT11(cStack_177,
                                                                                       local_178))))
                                                  ))) == 0x656c6261747369) {
                      iVar6 = getindex_aux(L,L1,&local_40);
                      iVar6 = lua_type(L1,iVar6);
                      bVar17 = iVar6 == 5;
                      goto LAB_00135062;
                    }
                    if (CONCAT17(uStack_16e,
                                 CONCAT16(uStack_16f,
                                          CONCAT15(local_170,
                                                   CONCAT14(uStack_171,
                                                            CONCAT13(uStack_172,
                                                                     CONCAT12(uStack_173,
                                                                              CONCAT11(cStack_174,
                                                                                       uStack_175)))
                                                           )))) == 0x6c617661746164 &&
                        CONCAT17(uStack_171,
                                 CONCAT16(uStack_172,
                                          CONCAT15(uStack_173,
                                                   CONCAT14(cStack_174,
                                                            CONCAT13(uStack_175,
                                                                     CONCAT12(uStack_176,
                                                                              CONCAT11(cStack_177,
                                                                                       local_178))))
                                                  ))) == 0x7661746164757369) {
                      iVar6 = getindex_aux(L,L1,&local_40);
                      iVar6 = lua_type(L1,iVar6);
                      uVar7 = (uint)(iVar6 == 2);
LAB_00135166:
                      lua_pushboolean(L1,uVar7);
                    }
                    else {
                      if (CONCAT17(uStack_16e,
                                   CONCAT16(uStack_16f,
                                            CONCAT15(local_170,
                                                     CONCAT14(uStack_171,
                                                              CONCAT13(uStack_172,
                                                                       CONCAT12(uStack_173,
                                                                                CONCAT11(cStack_174,
                                                                                         uStack_175)
                                                                               )))))) ==
                          0x61746164726573 &&
                          CONCAT17(uStack_171,
                                   CONCAT16(uStack_172,
                                            CONCAT15(uStack_173,
                                                     CONCAT14(cStack_174,
                                                              CONCAT13(uStack_175,
                                                                       CONCAT12(uStack_176,
                                                                                CONCAT11(cStack_177,
                                                                                         local_178))
                                                                      ))))) == 0x6164726573757369) {
                        iVar6 = getindex_aux(L,L1,&local_40);
                        uVar7 = lua_isuserdata(L1,iVar6);
                        goto LAB_00135166;
                      }
                      if (CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)))
                          == 0x6e656c) {
                        iVar6 = getindex_aux(L,L1,&local_40);
                        lua_len(L1,iVar6);
                        goto LAB_0013516b;
                      }
                      if (cStack_174 == '\0' &&
                          CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)))
                          == 0x6e656c4c) {
                        iVar6 = getindex_aux(L,L1,&local_40);
                        sVar8 = luaL_len(L1,iVar6);
LAB_001352df:
                        lua_pushinteger(L1,sVar8);
                        goto LAB_0013516b;
                      }
                      if (local_170 == '\0' &&
                          CONCAT17(uStack_171,
                                   CONCAT16(uStack_172,
                                            CONCAT15(uStack_173,
                                                     CONCAT14(cStack_174,
                                                              CONCAT13(uStack_175,
                                                                       CONCAT12(uStack_176,
                                                                                CONCAT11(cStack_177,
                                                                                         local_178))
                                                                      ))))) == 0x656c696664616f6c) {
                        iVar5 = getnum_aux(L,L1,&local_40);
                        iVar6 = 0;
                        pcVar13 = luaL_checklstring(L1,iVar5,(size_t *)0x0);
                        luaL_loadfilex(L1,pcVar13,(char *)0x0);
                        goto LAB_00134ac2;
                      }
                      if (CONCAT17(uStack_16e,
                                   CONCAT16(uStack_16f,
                                            CONCAT15(local_170,
                                                     CONCAT14(uStack_171,
                                                              CONCAT13(uStack_172,
                                                                       CONCAT12(uStack_173,
                                                                                CONCAT11(cStack_174,
                                                                                         uStack_175)
                                                                               )))))) ==
                          0x676e6972747364 &&
                          CONCAT17(uStack_171,
                                   CONCAT16(uStack_172,
                                            CONCAT15(uStack_173,
                                                     CONCAT14(cStack_174,
                                                              CONCAT13(uStack_175,
                                                                       CONCAT12(uStack_176,
                                                                                CONCAT11(cStack_177,
                                                                                         local_178))
                                                                      ))))) == 0x6972747364616f6c) {
                        iVar5 = getnum_aux(L,L1,&local_40);
                        iVar6 = 0;
                        pcVar13 = luaL_checklstring(L1,iVar5,(size_t *)0x0);
                        luaL_loadstring(L1,pcVar13);
                        goto LAB_00134ac2;
                      }
                      if (CONCAT17((undefined1)uStack_16c,
                                   CONCAT16(uStack_16d,
                                            CONCAT15(uStack_16e,
                                                     CONCAT14(uStack_16f,
                                                              CONCAT13(local_170,
                                                                       CONCAT12(uStack_171,
                                                                                CONCAT11(uStack_172,
                                                                                         uStack_173)
                                                                               )))))) ==
                          0x656c6261746174 &&
                          CONCAT17(uStack_171,
                                   CONCAT16(uStack_172,
                                            CONCAT15(uStack_173,
                                                     CONCAT14(cStack_174,
                                                              CONCAT13(uStack_175,
                                                                       CONCAT12(uStack_176,
                                                                                CONCAT11(cStack_177,
                                                                                         local_178))
                                                                      ))))) == 0x746174656d77656e) {
                        getstring_aux(L,&local_178,&local_40);
                        uVar7 = luaL_newmetatable(L1,&local_178);
LAB_00135368:
                        lua_pushboolean(L1,uVar7);
                        goto LAB_00134b5b;
                      }
                      if (local_170 == '\0' &&
                          CONCAT17(uStack_171,
                                   CONCAT16(uStack_172,
                                            CONCAT15(uStack_173,
                                                     CONCAT14(cStack_174,
                                                              CONCAT13(uStack_175,
                                                                       CONCAT12(uStack_176,
                                                                                CONCAT11(cStack_177,
                                                                                         local_178))
                                                                      ))))) == 0x656c62617477656e) {
                        iVar6 = 0;
                        lua_createtable(L1,0,0);
                        goto LAB_00134ac2;
                      }
                      if (CONCAT11(uStack_16f,local_170) == 100 &&
                          CONCAT17(uStack_171,
                                   CONCAT16(uStack_172,
                                            CONCAT15(uStack_173,
                                                     CONCAT14(cStack_174,
                                                              CONCAT13(uStack_175,
                                                                       CONCAT12(uStack_176,
                                                                                CONCAT11(cStack_177,
                                                                                         local_178))
                                                                      ))))) == 0x616572687477656e) {
                        lua_newthread(L1);
                      }
                      else if (CONCAT13(uStack_16d,
                                        CONCAT12(uStack_16e,CONCAT11(uStack_16f,local_170))) ==
                               0x617461 &&
                               CONCAT17(uStack_171,
                                        CONCAT16(uStack_172,
                                                 CONCAT15(uStack_173,
                                                          CONCAT14(cStack_174,
                                                                   CONCAT13(uStack_175,
                                                                            CONCAT12(uStack_176,
                                                                                     CONCAT11(
                                                  cStack_177,local_178))))))) == 0x647265737577656e)
                      {
                        iVar6 = getnum_aux(L,L1,&local_40);
                        lua_newuserdata(L1,(long)iVar6);
                      }
                      else {
                        if (cStack_174 != '\0' ||
                            CONCAT13(uStack_175,CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)))
                            != 0x7478656e) {
                          if (CONCAT17(uStack_171,
                                       CONCAT16(uStack_172,
                                                CONCAT15(uStack_173,
                                                         CONCAT14(cStack_174,
                                                                  CONCAT13(uStack_175,
                                                                           CONCAT12(uStack_176,
                                                                                    CONCAT11(
                                                  cStack_177,local_178))))))) == 0x657a69736a626f) {
                            iVar6 = getindex_aux(L,L1,&local_40);
                            sVar8 = lua_rawlen(L1,iVar6);
                            goto LAB_001352df;
                          }
                          if (CONCAT11(uStack_173,cStack_174) == 0x6c &&
                              CONCAT13(uStack_175,
                                       CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                              0x6c616370) {
                            iVar3 = getnum_aux(L,L1,&local_40);
                            iVar4 = getnum_aux(L,L1,&local_40);
                            iVar5 = getnum_aux(L,L1,&local_40);
                            lVar16 = 0;
                            pcVar15 = (lua_KFunction)0x0;
                          }
                          else {
                            if (CONCAT13(uStack_172,
                                         CONCAT12(uStack_173,CONCAT11(cStack_174,uStack_175))) !=
                                0x6b6c6c ||
                                CONCAT13(uStack_175,
                                         CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) !=
                                0x6c616370) {
                              if (CONCAT13(uStack_175,
                                           CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                                  0x706f70) {
                                uVar7 = getnum_aux(L,L1,&local_40);
                                uVar7 = ~uVar7;
LAB_00135417:
                                lua_settop(L1,uVar7);
                              }
                              else {
                                if (CONCAT17(uStack_16e,
                                             CONCAT16(uStack_16f,
                                                      CONCAT15(local_170,
                                                               CONCAT14(uStack_171,
                                                                        CONCAT13(uStack_172,
                                                                                 CONCAT12(uStack_173
                                                                                          ,CONCAT11(
                                                  cStack_174,uStack_175))))))) == 0x6b63617473746e
                                    && CONCAT17(uStack_171,
                                                CONCAT16(uStack_172,
                                                         CONCAT15(uStack_173,
                                                                  CONCAT14(cStack_174,
                                                                           CONCAT13(uStack_175,
                                                                                    CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                       0x617473746e697270) {
                                  iVar5 = getnum_aux(L,L1,&local_40);
                                  if (iVar5 != 0) {
                                    iVar6 = 0;
                                    pcVar13 = luaL_tolstring(L1,iVar5,(size_t *)0x0);
                                    puts(pcVar13);
                                    lua_settop(L1,-2);
                                    goto LAB_00134ac2;
                                  }
                                  printstack(L1);
                                  goto LAB_0013516b;
                                }
                                if (CONCAT11(uStack_173,cStack_174) == 0x74 &&
                                    CONCAT13(uStack_175,
                                             CONCAT12(uStack_176,CONCAT11(cStack_177,local_178))) ==
                                    0x6e697270) {
                                  getstring_aux(L,&local_178,&local_40);
                                  puts(&local_178);
                                  goto LAB_00134b5b;
                                }
                                if (local_170 == '\0' &&
                                    CONCAT17(uStack_171,
                                             CONCAT16(uStack_172,
                                                      CONCAT15(uStack_173,
                                                               CONCAT14(cStack_174,
                                                                        CONCAT13(uStack_175,
                                                                                 CONCAT12(uStack_176
                                                                                          ,CONCAT11(
                                                  cStack_177,local_178))))))) == 0x6c6f6f6268737570)
                                {
                                  uVar7 = getnum_aux(L,L1,&local_40);
                                  goto LAB_00135166;
                                }
                                if (CONCAT17((undefined1)uStack_16c,
                                             CONCAT16(uStack_16d,
                                                      CONCAT15(uStack_16e,
                                                               CONCAT14(uStack_16f,
                                                                        CONCAT13(local_170,
                                                                                 CONCAT12(uStack_171
                                                                                          ,CONCAT11(
                                                  uStack_172,uStack_173))))))) == 0x657275736f6c63
                                    && CONCAT17(uStack_171,
                                                CONCAT16(uStack_172,
                                                         CONCAT15(uStack_173,
                                                                  CONCAT14(cStack_174,
                                                                           CONCAT13(uStack_175,
                                                                                    CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                       0x6f6c636368737570) {
                                  iVar6 = getnum_aux(L,L1,&local_40);
                                  lua_pushcclosure(L1,testC,iVar6);
                                }
                                else {
                                  if (CONCAT17(uStack_171,
                                               CONCAT16(uStack_172,
                                                        CONCAT15(uStack_173,
                                                                 CONCAT14(cStack_174,
                                                                          CONCAT13(uStack_175,
                                                                                   CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                      0x746e6968737570) {
                                    iVar6 = getnum_aux(L,L1,&local_40);
LAB_00135578:
                                    sVar8 = (size_t)iVar6;
                                    goto LAB_001352df;
                                  }
                                  if (CONCAT17(uStack_171,
                                               CONCAT16(uStack_172,
                                                        CONCAT15(uStack_173,
                                                                 CONCAT14(cStack_174,
                                                                          CONCAT13(uStack_175,
                                                                                   CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                      0x6c696e68737570) {
                                    lua_pushnil(L1);
                                  }
                                  else if (CONCAT17(uStack_171,
                                                    CONCAT16(uStack_172,
                                                             CONCAT15(uStack_173,
                                                                      CONCAT14(cStack_174,
                                                                               CONCAT13(uStack_175,
                                                                                        CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                           0x6d756e68737570) {
                                    iVar6 = getnum_aux(L,L1,&local_40);
                                    auVar19._0_8_ = (double)iVar6;
                                    auVar19._8_8_ = uVar20;
LAB_00135660:
                                    in_ZMM0 = ZEXT1664(auVar19);
                                    lua_pushnumber(L1,auVar19._0_8_);
                                  }
                                  else {
                                    if (CONCAT17(uStack_16e,
                                                 CONCAT16(uStack_16f,
                                                          CONCAT15(local_170,
                                                                   CONCAT14(uStack_171,
                                                                            CONCAT13(uStack_172,
                                                                                     CONCAT12(
                                                  uStack_173,CONCAT11(cStack_174,uStack_175)))))))
                                        != 0x73757461747368 ||
                                        CONCAT17(uStack_171,
                                                 CONCAT16(uStack_172,
                                                          CONCAT15(uStack_173,
                                                                   CONCAT14(cStack_174,
                                                                            CONCAT13(uStack_175,
                                                                                     CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) !=
                                        0x7461747368737570) {
                                      if (CONCAT17(uStack_16e,
                                                   CONCAT16(uStack_16f,
                                                            CONCAT15(local_170,
                                                                     CONCAT14(uStack_171,
                                                                              CONCAT13(uStack_172,
                                                                                       CONCAT12(
                                                  uStack_173,CONCAT11(cStack_174,uStack_175)))))))
                                          == 0x676e6972747368 &&
                                          CONCAT17(uStack_171,
                                                   CONCAT16(uStack_172,
                                                            CONCAT15(uStack_173,
                                                                     CONCAT14(cStack_174,
                                                                              CONCAT13(uStack_175,
                                                                                       CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                          0x6972747368737570) {
                                        getstring_aux(L,&local_178,&local_40);
                                        lua_pushstring(L1,&local_178);
                                        goto LAB_00134b5b;
                                      }
                                      if ((local_168 == '\0' &&
                                          CONCAT17(uStack_171,
                                                   CONCAT16(uStack_172,
                                                            CONCAT15(uStack_173,
                                                                     CONCAT14(cStack_174,
                                                                              CONCAT13(uStack_175,
                                                                                       CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                          0x6176707568737570) &&
                                          CONCAT44(uStack_16c,
                                                   CONCAT13(uStack_16d,
                                                            CONCAT12(uStack_16e,
                                                                     CONCAT11(uStack_16f,local_170))
                                                           )) == 0x7865646e6965756c) {
                                        iVar6 = getnum_aux(L,L1,&local_40);
                                        iVar6 = -0xf4628 - iVar6;
                                        goto LAB_00135578;
                                      }
                                      if (CONCAT11(uStack_16f,local_170) == 0x65 &&
                                          CONCAT17(uStack_171,
                                                   CONCAT16(uStack_172,
                                                            CONCAT15(uStack_173,
                                                                     CONCAT14(cStack_174,
                                                                              CONCAT13(uStack_175,
                                                                                       CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                          0x756c617668737570) {
                                        iVar6 = getindex_aux(L,L1,&local_40);
                                        lua_pushvalue(L1,iVar6);
                                        goto LAB_0013516b;
                                      }
                                      if (CONCAT17((undefined1)uStack_16c,
                                                   CONCAT16(uStack_16d,
                                                            CONCAT15(uStack_16e,
                                                                     CONCAT14(uStack_16f,
                                                                              CONCAT13(local_170,
                                                                                       CONCAT12(
                                                  uStack_171,CONCAT11(uStack_172,uStack_173)))))))
                                          == 0x49676e69727473 &&
                                          CONCAT17(uStack_171,
                                                   CONCAT16(uStack_172,
                                                            CONCAT15(uStack_173,
                                                                     CONCAT14(cStack_174,
                                                                              CONCAT13(uStack_175,
                                                                                       CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                          0x7274736668737570) {
                                        iVar6 = 0;
                                        pcVar13 = lua_tolstring(L,-2,(size_t *)0x0);
                                        uVar9 = lua_tointegerx(L,-1,(int *)0x0);
                                        lua_pushfstring(L1,pcVar13,uVar9 & 0xffffffff);
                                        goto LAB_00134ac2;
                                      }
                                      if (CONCAT17((undefined1)uStack_16c,
                                                   CONCAT16(uStack_16d,
                                                            CONCAT15(uStack_16e,
                                                                     CONCAT14(uStack_16f,
                                                                              CONCAT13(local_170,
                                                                                       CONCAT12(
                                                  uStack_171,CONCAT11(uStack_172,uStack_173)))))))
                                          == 0x53676e69727473 &&
                                          CONCAT17(uStack_171,
                                                   CONCAT16(uStack_172,
                                                            CONCAT15(uStack_173,
                                                                     CONCAT14(cStack_174,
                                                                              CONCAT13(uStack_175,
                                                                                       CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) ==
                                          0x7274736668737570) {
                                        pcVar13 = lua_tolstring(L,-2,(size_t *)0x0);
                                        pcVar12 = lua_tolstring(L,-1,(size_t *)0x0);
                                      }
                                      else {
                                        if (CONCAT17((undefined1)uStack_16c,
                                                     CONCAT16(uStack_16d,
                                                              CONCAT15(uStack_16e,
                                                                       CONCAT14(uStack_16f,
                                                                                CONCAT13(local_170,
                                                                                         CONCAT12(
                                                  uStack_171,CONCAT11(uStack_172,uStack_173)))))))
                                            != 0x50676e69727473 ||
                                            CONCAT17(uStack_171,
                                                     CONCAT16(uStack_172,
                                                              CONCAT15(uStack_173,
                                                                       CONCAT14(cStack_174,
                                                                                CONCAT13(uStack_175,
                                                                                         CONCAT12(
                                                  uStack_176,CONCAT11(cStack_177,local_178))))))) !=
                                            0x7274736668737570) {
                                          if (CONCAT17(uStack_171,
                                                       CONCAT16(uStack_172,
                                                                CONCAT15(uStack_173,
                                                                         CONCAT14(cStack_174,
                                                                                  CONCAT13(
                                                  uStack_175,
                                                  CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)
                                                          )))))) == 0x69746567776172) {
                                            iVar6 = getindex_aux(L,L1,&local_40);
                                            iVar5 = getnum_aux(L,L1,&local_40);
                                            lua_rawgeti(L1,iVar6,(long)iVar5);
                                          }
                                          else if (CONCAT17(uStack_171,
                                                            CONCAT16(uStack_172,
                                                                     CONCAT15(uStack_173,
                                                                              CONCAT14(cStack_174,
                                                                                       CONCAT13(
                                                  uStack_175,
                                                  CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)
                                                          )))))) == 0x70746567776172) {
                                            iVar6 = getindex_aux(L,L1,&local_40);
                                            iVar5 = getnum_aux(L,L1,&local_40);
                                            lua_rawgetp(L1,iVar6,(void *)(long)iVar5);
                                          }
                                          else {
                                            if (CONCAT17(uStack_171,
                                                         CONCAT16(uStack_172,
                                                                  CONCAT15(uStack_173,
                                                                           CONCAT14(cStack_174,
                                                                                    CONCAT13(
                                                  uStack_175,
                                                  CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)
                                                          )))))) != 0x70746573776172) {
                                              if (CONCAT13(uStack_172,
                                                           CONCAT12(uStack_173,
                                                                    CONCAT11(cStack_174,uStack_175))
                                                          ) == 0x65766f &&
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  == 0x6f6d6572) {
                                                iVar6 = getnum_aux(L,L1,&local_40);
                                                lua_rotate(L1,iVar6,-1);
                                              }
                                              else {
                                                if (CONCAT17(uStack_171,
                                                             CONCAT16(uStack_172,
                                                                      CONCAT15(uStack_173,
                                                                               CONCAT14(cStack_174,
                                                                                        CONCAT13(
                                                  uStack_175,
                                                  CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)
                                                          )))))) != 0x6563616c706572) {
                                                  if (CONCAT13(uStack_172,
                                                               CONCAT12(uStack_173,
                                                                        CONCAT11(cStack_174,
                                                                                 uStack_175))) ==
                                                      0x656d75 &&
                                                      CONCAT13(uStack_175,
                                                               CONCAT12(uStack_176,
                                                                        CONCAT11(cStack_177,
                                                                                 local_178))) ==
                                                      0x75736572) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    plVar14 = lua_tothread(L1,iVar6);
                                                    iVar6 = getnum_aux(L,L1,&local_40);
                                                    local_17c = lua_resume(plVar14,L,iVar6);
                                                  }
                                                  else {
                                                    if (CONCAT13(uStack_172,
                                                                 CONCAT12(uStack_173,
                                                                          CONCAT11(cStack_174,
                                                                                   uStack_175))) ==
                                                        0x6e7275 &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x75746572) {
                                                      local_180 = getnum_aux(L,L1,&local_40);
                                                      if (0 < local_180 && L1 != L) {
                                                        iVar6 = -local_180;
                                                        do {
                                                          pcVar13 = lua_tolstring(L1,iVar6,(size_t *
                                                  )0x0);
                                                  lua_pushstring(L,pcVar13);
                                                  iVar6 = iVar6 + 1;
                                                  } while (iVar6 != 0);
                                                  }
LAB_00135b77:
                                                  iVar6 = 1;
                                                  goto LAB_00134ac2;
                                                  }
                                                  if (CONCAT13(uStack_172,
                                                               CONCAT12(uStack_173,
                                                                        CONCAT11(cStack_174,
                                                                                 uStack_175))) !=
                                                      0x657461 ||
                                                      CONCAT13(uStack_175,
                                                               CONCAT12(uStack_176,
                                                                        CONCAT11(cStack_177,
                                                                                 local_178))) !=
                                                      0x61746f72) {
                                                    if (local_170 == '\0' &&
                                                        CONCAT17(uStack_171,
                                                                 CONCAT16(uStack_172,
                                                                          CONCAT15(uStack_173,
                                                                                   CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x646c656966746573) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    getstring_aux(L,&local_178,&local_40);
                                                    lua_setfield(L1,iVar6,&local_178);
                                                  }
                                                  else if (CONCAT11(uStack_16f,local_170) == 0x6c &&
                                                           CONCAT17(uStack_171,
                                                                    CONCAT16(uStack_172,
                                                                             CONCAT15(uStack_173,
                                                                                      CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x61626f6c67746573) {
                                                    getstring_aux(L,&local_178,&local_40);
                                                    lua_setglobal(L1,&local_178);
                                                  }
                                                  else {
                                                    if (CONCAT17(uStack_171,
                                                                 CONCAT16(uStack_172,
                                                                          CONCAT15(uStack_173,
                                                                                   CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) != 0x6b6f6f68746573) {
                                                    if (CONCAT17((undefined1)uStack_16c,
                                                                 CONCAT16(uStack_16d,
                                                                          CONCAT15(uStack_16e,
                                                                                   CONCAT14(
                                                  uStack_16f,
                                                  CONCAT13(local_170,
                                                           CONCAT12(uStack_171,
                                                                    CONCAT11(uStack_172,uStack_173))
                                                          ))))) == 0x656c6261746174 &&
                                                  CONCAT17(uStack_171,
                                                           CONCAT16(uStack_172,
                                                                    CONCAT15(uStack_173,
                                                                             CONCAT14(cStack_174,
                                                                                      CONCAT13(
                                                  uStack_175,
                                                  CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)
                                                          )))))) == 0x746174656d746573) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    lua_setmetatable(L1,iVar6);
                                                  }
                                                  else if (local_170 == '\0' &&
                                                           CONCAT17(uStack_171,
                                                                    CONCAT16(uStack_172,
                                                                             CONCAT15(uStack_173,
                                                                                      CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x656c626174746573) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    lua_settable(L1,iVar6);
                                                  }
                                                  else {
                                                    if (CONCAT13(uStack_172,
                                                                 CONCAT12(uStack_173,
                                                                          CONCAT11(cStack_174,
                                                                                   uStack_175))) ==
                                                        0x706f74 &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x74746573) {
                                                      uVar7 = getnum_aux(L,L1,&local_40);
                                                      goto LAB_00135417;
                                                    }
                                                    if (CONCAT11(uStack_16f,local_170) == 0x61 &&
                                                        CONCAT17(uStack_171,
                                                                 CONCAT16(uStack_172,
                                                                          CONCAT15(uStack_173,
                                                                                   CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x7461647574736574) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    getstring_aux(L,&local_178,&local_40);
                                                    pvVar11 = luaL_testudata(L1,iVar6,&local_178);
                                                    uVar7 = (uint)(pvVar11 != (void *)0x0);
                                                    goto LAB_00135368;
                                                  }
                                                  if (CONCAT11(uStack_173,cStack_174) != 0x72 ||
                                                      CONCAT13(uStack_175,
                                                               CONCAT12(uStack_176,
                                                                        CONCAT11(cStack_177,
                                                                                 local_178))) !=
                                                      0x6f727265) {
                                                    if (CONCAT11(uStack_173,cStack_174) == 0x74 &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x726f6261) {
                                                      abort();
                                                    }
                                                    if (CONCAT11(uStack_173,cStack_174) == 0x77 &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x6f726874) {
                                                      luaL_error(L1,"C++");
                                                      iVar6 = 2;
                                                    }
                                                    else {
                                                      if (CONCAT13(uStack_172,
                                                                   CONCAT12(uStack_173,
                                                                            CONCAT11(cStack_174,
                                                                                     uStack_175)))
                                                          == 0x6c6f6f &&
                                                          CONCAT13(uStack_175,
                                                                   CONCAT12(uStack_176,
                                                                            CONCAT11(cStack_177,
                                                                                     local_178))) ==
                                                          0x6f626f74) {
                                                        iVar6 = getindex_aux(L,L1,&local_40);
                                                        uVar7 = lua_toboolean(L1,iVar6);
                                                        goto LAB_00135166;
                                                      }
                                                      if (CONCAT13(uStack_16d,
                                                                   CONCAT12(uStack_16e,
                                                                            CONCAT11(uStack_16f,
                                                                                     local_170))) ==
                                                          0x6e6f69 &&
                                                          CONCAT17(uStack_171,
                                                                   CONCAT16(uStack_172,
                                                                            CONCAT15(uStack_173,
                                                                                     CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x74636e7566636f74) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    p_Var10 = lua_tocfunction(L1,iVar6);
                                                    iVar6 = 0;
                                                    lua_pushcclosure(L1,p_Var10,0);
                                                  }
                                                  else if (CONCAT11(uStack_16f,local_170) == 0x72 &&
                                                           CONCAT17(uStack_171,
                                                                    CONCAT16(uStack_172,
                                                                             CONCAT15(uStack_173,
                                                                                      CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x656765746e696f74) {
                                                    iVar5 = getindex_aux(L,L1,&local_40);
                                                    iVar6 = 0;
                                                    n = lua_tointegerx(L1,iVar5,(int *)0x0);
                                                    lua_pushinteger(L1,n);
                                                  }
                                                  else if (local_170 == '\0' &&
                                                           CONCAT17(uStack_171,
                                                                    CONCAT16(uStack_172,
                                                                             CONCAT15(uStack_173,
                                                                                      CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x7265626d756e6f74) {
                                                    iVar5 = getindex_aux(L,L1,&local_40);
                                                    iVar6 = 0;
                                                    in_ZMM0._0_8_ =
                                                         lua_tonumberx(L1,iVar5,(int *)0x0);
                                                    in_ZMM0._8_56_ = extraout_var;
                                                    lua_pushnumber(L1,in_ZMM0._0_8_);
                                                  }
                                                  else {
                                                    if (CONCAT11(uStack_16f,local_170) == 0x72 &&
                                                        CONCAT17(uStack_171,
                                                                 CONCAT16(uStack_172,
                                                                          CONCAT15(uStack_173,
                                                                                   CONCAT14(
                                                  cStack_174,
                                                  CONCAT13(uStack_175,
                                                           CONCAT12(uStack_176,
                                                                    CONCAT11(cStack_177,local_178)))
                                                  )))) == 0x65746e696f706f74) {
                                                    iVar6 = getindex_aux(L,L1,&local_40);
                                                    pvVar11 = lua_topointer(L1,iVar6);
                                                    auVar19 = vcvtusi2sd_avx512f(auVar18,pvVar11);
                                                    goto LAB_00135660;
                                                  }
                                                  if (local_170 != '\0' ||
                                                      CONCAT17(uStack_171,
                                                               CONCAT16(uStack_172,
                                                                        CONCAT15(uStack_173,
                                                                                 CONCAT14(cStack_174
                                                                                          ,CONCAT13(
                                                  uStack_175,
                                                  CONCAT12(uStack_176,CONCAT11(cStack_177,local_178)
                                                          )))))) != 0x676e697274736f74) {
                                                    if (cStack_174 == '\0' &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x65707974) {
                                                      iVar6 = getnum_aux(L,L1,&local_40);
                                                      iVar6 = lua_type(L1,iVar6);
                                                      pcVar13 = lua_typename(L1,iVar6);
                                                      goto LAB_00135803;
                                                    }
                                                    if (CONCAT11(uStack_173,cStack_174) == 0x65 &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x766f6d78) {
                                                      iVar6 = getindex_aux(L,L1,&local_40);
                                                      iVar5 = getindex_aux(L,L1,&local_40);
                                                      plVar14 = L1;
                                                      if (iVar6 != 0) {
                                                        plVar14 = lua_tothread(L1,iVar6);
                                                      }
                                                      to = L1;
                                                      if (iVar5 != 0) {
                                                        to = lua_tothread(L1,iVar5);
                                                      }
                                                      iVar6 = getnum_aux(L,L1,&local_40);
                                                      if (iVar6 == 0) {
                                                        iVar6 = lua_gettop(plVar14);
                                                      }
                                                      lua_xmove(plVar14,to,iVar6);
                                                      goto LAB_0013516b;
                                                    }
                                                    if (CONCAT11(uStack_173,cStack_174) == 100 &&
                                                        CONCAT13(uStack_175,
                                                                 CONCAT12(uStack_176,
                                                                          CONCAT11(cStack_177,
                                                                                   local_178))) ==
                                                        0x6c656979) {
                                                      iVar6 = getnum_aux(L,L1,&local_40);
                                                      lVar16 = 0;
                                                      pcVar15 = (lua_KFunction)0x0;
                                                    }
                                                    else {
                                                      if (CONCAT13(uStack_172,
                                                                   CONCAT12(uStack_173,
                                                                            CONCAT11(cStack_174,
                                                                                     uStack_175)))
                                                          != 0x6b646c ||
                                                          CONCAT13(uStack_175,
                                                                   CONCAT12(uStack_176,
                                                                            CONCAT11(cStack_177,
                                                                                     local_178))) !=
                                                          0x6c656979) {
                                                        iVar6 = 0;
                                                        luaL_error(L,"unknown instruction %s",
                                                                   &local_178);
                                                        goto LAB_00134ac2;
                                                      }
                                                      iVar6 = getnum_aux(L,L1,&local_40);
                                                      iVar5 = getindex_aux(L,L1,&local_40);
                                                      lVar16 = (lua_KContext)iVar5;
                                                      pcVar15 = Cfunck;
                                                    }
                                                    local_180 = lua_yieldk(L1,iVar6,lVar16,pcVar15);
                                                    goto LAB_00135b77;
                                                  }
                                                  iVar5 = getindex_aux(L,L1,&local_40);
                                                  iVar6 = 0;
                                                  pcVar13 = lua_tolstring(L1,iVar5,(size_t *)0x0);
                                                  pcVar12 = lua_pushstring(L1,pcVar13);
                                                  if ((pcVar13 != (char *)0x0 ||
                                                       pcVar12 != (char *)0x0) &&
                                                     (iVar5 = strcmp(pcVar13,pcVar12), iVar5 != 0))
                                                  {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                                                  ,0x5f3,
                                                  "int runC(lua_State *, lua_State *, const char *)"
                                                  );
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00134ac2;
                                                  }
                                                  lua_error(L1);
                                                  }
                                                  goto LAB_0013516b;
                                                  }
                                                  iVar6 = getnum_aux(L,L1,&local_40);
                                                  iVar5 = getnum_aux(L,L1,&local_40);
                                                  getstring_aux(L,&local_178,&local_40);
                                                  sethookaux(L1,iVar6,iVar5,&local_178);
                                                  }
                                                  goto LAB_00134b5b;
                                                  }
                                                  iVar6 = getindex_aux(L,L1,&local_40);
                                                  iVar5 = getnum_aux(L,L1,&local_40);
                                                  lua_rotate(L1,iVar6,iVar5);
                                                  }
                                                  goto LAB_0013516b;
                                                }
                                                iVar6 = getindex_aux(L,L1,&local_40);
                                                lua_copy(L1,-1,iVar6);
                                              }
                                              uVar7 = 0xfffffffe;
                                              goto LAB_00135417;
                                            }
                                            iVar6 = getindex_aux(L,L1,&local_40);
                                            iVar5 = getnum_aux(L,L1,&local_40);
                                            lua_rawsetp(L1,iVar6,(void *)(long)iVar5);
                                          }
                                          goto LAB_0013516b;
                                        }
                                        pcVar13 = lua_tolstring(L,-2,(size_t *)0x0);
                                        pcVar12 = (char *)lua_topointer(L,-1);
                                      }
                                      iVar6 = 0;
                                      lua_pushfstring(L1,pcVar13,pcVar12);
                                      goto LAB_00134ac2;
                                    }
                                    pcVar13 = *(char **)(pushcode_codes + (long)local_17c * 8);
LAB_00135803:
                                    lua_pushstring(L1,pcVar13);
                                  }
                                }
                              }
                              goto LAB_0013516b;
                            }
                            iVar3 = getnum_aux(L,L1,&local_40);
                            iVar4 = getnum_aux(L,L1,&local_40);
                            iVar6 = getindex_aux(L,L1,&local_40);
                            lVar16 = (lua_KContext)iVar6;
                            iVar5 = 0;
                            pcVar15 = Cfunck;
                          }
                          iVar6 = 0;
                          local_17c = lua_pcallk(L1,iVar3,iVar4,iVar5,lVar16,pcVar15);
                          goto LAB_00134ac2;
                        }
                        lua_next(L1,-2);
                      }
                    }
LAB_0013516b:
                    iVar6 = 0;
                    goto LAB_00134ac2;
                  }
                  iVar6 = getindex_aux(L,L1,&local_40);
                  uVar7 = lua_isstring(L1,iVar6);
                }
              }
LAB_00135069:
              lua_pushboolean(L1,uVar7);
            }
          }
          goto LAB_00134abf;
        }
        getstring_aux(L,&local_178,&local_40);
        iVar6 = 0;
        iVar5 = (cStack_177 != 'T') + 1;
        if (local_178 == 'E') {
          iVar5 = iVar6;
        }
        iVar3 = getindex_aux(L,L1,&local_40);
        iVar4 = getindex_aux(L,L1,&local_40);
        iVar5 = lua_compare(L1,iVar3,iVar4,iVar5);
        lua_pushboolean(L1,iVar5);
      }
    }
LAB_00134ac2:
    if (iVar6 != 0) {
      if (iVar6 == 2) {
        local_180 = 0;
      }
      return local_180;
    }
  } while( true );
}

Assistant:

static int runC (lua_State *L, lua_State *L1, const char *pc) {
  char buff[300];
  int status = 0;
  if (pc == NULL) return luaL_error(L, "attempt to runC null script");
  for (;;) {
    const char *inst = getstring;
    if EQ("") return 0;
    else if EQ("absindex") {
      lua_pushnumber(L1, lua_absindex(L1, getindex));
    }
    else if EQ("append") {
      int t = getindex;
      int i = lua_rawlen(L1, t);
      lua_rawseti(L1, t, i + 1);
    }
    else if EQ("arith") {
      int op;
      skip(&pc);
      op = strchr(ops, *pc++) - ops;
      lua_arith(L1, op);
    }
    else if EQ("call") {
      int narg = getnum;
      int nres = getnum;
      lua_call(L1, narg, nres);
    }
    else if EQ("callk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      lua_callk(L1, narg, nres, i, Cfunck);
    }
    else if EQ("checkstack") {
      int sz = getnum;
      const char *msg = getstring;
      if (*msg == '\0')
        msg = NULL;  /* to test 'luaL_checkstack' with no message */
      luaL_checkstack(L1, sz, msg);
    }
    else if EQ("compare") {
      const char *opt = getstring;  /* EQ, LT, or LE */
      int op = (opt[0] == 'E') ? LUA_OPEQ
                               : (opt[1] == 'T') ? LUA_OPLT : LUA_OPLE;
      int a = getindex;
      int b = getindex;
      lua_pushboolean(L1, lua_compare(L1, a, b, op));
    }
    else if EQ("concat") {
      lua_concat(L1, getnum);
    }
    else if EQ("copy") {
      int f = getindex;
      lua_copy(L1, f, getindex);
    }
    else if EQ("func2num") {
      lua_CFunction func = lua_tocfunction(L1, getindex);
      lua_pushnumber(L1, cast(size_t, func));
    }
    else if EQ("getfield") {
      int t = getindex;
      lua_getfield(L1, t, getstring);
    }
    else if EQ("getglobal") {
      lua_getglobal(L1, getstring);
    }
    else if EQ("getmetatable") {
      if (lua_getmetatable(L1, getindex) == 0)
        lua_pushnil(L1);
    }
    else if EQ("gettable") {
      lua_gettable(L1, getindex);
    }
    else if EQ("gettop") {
      lua_pushinteger(L1, lua_gettop(L1));
    }
    else if EQ("gsub") {
      int a = getnum; int b = getnum; int c = getnum;
      luaL_gsub(L1, lua_tostring(L1, a),
                    lua_tostring(L1, b),
                    lua_tostring(L1, c));
    }
    else if EQ("insert") {
      lua_insert(L1, getnum);
    }
    else if EQ("iscfunction") {
      lua_pushboolean(L1, lua_iscfunction(L1, getindex));
    }
    else if EQ("isfunction") {
      lua_pushboolean(L1, lua_isfunction(L1, getindex));
    }
    else if EQ("isnil") {
      lua_pushboolean(L1, lua_isnil(L1, getindex));
    }
    else if EQ("isnull") {
      lua_pushboolean(L1, lua_isnone(L1, getindex));
    }
    else if EQ("isnumber") {
      lua_pushboolean(L1, lua_isnumber(L1, getindex));
    }
    else if EQ("isstring") {
      lua_pushboolean(L1, lua_isstring(L1, getindex));
    }
    else if EQ("istable") {
      lua_pushboolean(L1, lua_istable(L1, getindex));
    }
    else if EQ("isudataval") {
      lua_pushboolean(L1, lua_islightuserdata(L1, getindex));
    }
    else if EQ("isuserdata") {
      lua_pushboolean(L1, lua_isuserdata(L1, getindex));
    }
    else if EQ("len") {
      lua_len(L1, getindex);
    }
    else if EQ("Llen") {
      lua_pushinteger(L1, luaL_len(L1, getindex));
    }
    else if EQ("loadfile") {
      luaL_loadfile(L1, luaL_checkstring(L1, getnum));
    }
    else if EQ("loadstring") {
      const char *s = luaL_checkstring(L1, getnum);
      luaL_loadstring(L1, s);
    }
    else if EQ("newmetatable") {
      lua_pushboolean(L1, luaL_newmetatable(L1, getstring));
    }
    else if EQ("newtable") {
      lua_newtable(L1);
    }
    else if EQ("newthread") {
      lua_newthread(L1);
    }
    else if EQ("newuserdata") {
      lua_newuserdata(L1, getnum);
    }
    else if EQ("next") {
      lua_next(L1, -2);
    }
    else if EQ("objsize") {
      lua_pushinteger(L1, lua_rawlen(L1, getindex));
    }
    else if EQ("pcall") {
      int narg = getnum;
      int nres = getnum;
      status = lua_pcall(L1, narg, nres, getnum);
    }
    else if EQ("pcallk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      status = lua_pcallk(L1, narg, nres, 0, i, Cfunck);
    }
    else if EQ("pop") {
      lua_pop(L1, getnum);
    }
    else if EQ("printstack") {
      int n = getnum;
      if (n != 0) {
        printf("%s\n", luaL_tolstring(L1, n, NULL));
        lua_pop(L1, 1);
      }
      else printstack(L1);
    }
    else if EQ("print") {
      const char *msg = getstring;
      printf("%s\n", msg);
    }

    else if EQ("pushbool") {
      lua_pushboolean(L1, getnum);
    }
    else if EQ("pushcclosure") {
      lua_pushcclosure(L1, testC, getnum);
    }
    else if EQ("pushint") {
      lua_pushinteger(L1, getnum);
    }
    else if EQ("pushnil") {
      lua_pushnil(L1);
    }
    else if EQ("pushnum") {
      lua_pushnumber(L1, (lua_Number)getnum);
    }
    else if EQ("pushstatus") {
      pushcode(L1, status);
    }
    else if EQ("pushstring") {
      lua_pushstring(L1, getstring);
    }
    else if EQ("pushupvalueindex") {
      lua_pushinteger(L1, lua_upvalueindex(getnum));
    }
    else if EQ("pushvalue") {
      lua_pushvalue(L1, getindex);
    }
    else if EQ("pushfstringI") {
      lua_pushfstring(L1, lua_tostring(L, -2), (int)lua_tointeger(L, -1));
    }
    else if EQ("pushfstringS") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_tostring(L, -1));
    }
    else if EQ("pushfstringP") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_topointer(L, -1));
    }
    else if EQ("rawgeti") {
      int t = getindex;
      lua_rawgeti(L1, t, getnum);
    }
    else if EQ("rawgetp") {
      int t = getindex;
      lua_rawgetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("rawsetp") {
      int t = getindex;
      lua_rawsetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("remove") {
      lua_remove(L1, getnum);
    }
    else if EQ("replace") {
      lua_replace(L1, getindex);
    }
    else if EQ("resume") {
      int i = getindex;
      status = lua_resume(lua_tothread(L1, i), L, getnum);
    }
    else if EQ("return") {
      int n = getnum;
      if (L1 != L) {
        int i;
        for (i = 0; i < n; i++)
          lua_pushstring(L, lua_tostring(L1, -(n - i)));
      }
      return n;
    }
    else if EQ("rotate") {
      int i = getindex;
      lua_rotate(L1, i, getnum);
    }
    else if EQ("setfield") {
      int t = getindex;
      lua_setfield(L1, t, getstring);
    }
    else if EQ("setglobal") {
      lua_setglobal(L1, getstring);
    }
    else if EQ("sethook") {
      int mask = getnum;
      int count = getnum;
      sethookaux(L1, mask, count, getstring);
    }
    else if EQ("setmetatable") {
      lua_setmetatable(L1, getindex);
    }
    else if EQ("settable") {
      lua_settable(L1, getindex);
    }
    else if EQ("settop") {
      lua_settop(L1, getnum);
    }
    else if EQ("testudata") {
      int i = getindex;
      lua_pushboolean(L1, luaL_testudata(L1, i, getstring) != NULL);
    }
    else if EQ("error") {
      lua_error(L1);
    }
    else if EQ("abort") {
      abort();
    }
    else if EQ("throw") {
#if defined(__cplusplus)
static struct X { int x; } x;
      throw x;
#else
      luaL_error(L1, "C++");
#endif
      break;
    }
    else if EQ("tobool") {
      lua_pushboolean(L1, lua_toboolean(L1, getindex));
    }
    else if EQ("tocfunction") {
      lua_pushcfunction(L1, lua_tocfunction(L1, getindex));
    }
    else if EQ("tointeger") {
      lua_pushinteger(L1, lua_tointeger(L1, getindex));
    }
    else if EQ("tonumber") {
      lua_pushnumber(L1, lua_tonumber(L1, getindex));
    }
    else if EQ("topointer") {
      lua_pushnumber(L1, cast(size_t, lua_topointer(L1, getindex)));
    }
    else if EQ("tostring") {
      const char *s = lua_tostring(L1, getindex);
      const char *s1 = lua_pushstring(L1, s);
      lua_longassert((s == NULL && s1 == NULL) || strcmp(s, s1) == 0);
    }
    else if EQ("type") {
      lua_pushstring(L1, luaL_typename(L1, getnum));
    }
    else if EQ("xmove") {
      int f = getindex;
      int t = getindex;
      lua_State *fs = (f == 0) ? L1 : lua_tothread(L1, f);
      lua_State *ts = (t == 0) ? L1 : lua_tothread(L1, t);
      int n = getnum;
      if (n == 0) n = lua_gettop(fs);
      lua_xmove(fs, ts, n);
    }
    else if EQ("yield") {
      return lua_yield(L1, getnum);
    }
    else if EQ("yieldk") {
      int nres = getnum;
      int i = getindex;
      return lua_yieldk(L1, nres, i, Cfunck);
    }
    else luaL_error(L, "unknown instruction %s", buff);
  }
  return 0;
}